

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

ssize_t __thiscall vox::DICT::write(DICT *this,int __fd,void *__buf,size_t __n)

{
  size_type sVar1;
  reference this_00;
  DICT *__n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  uint local_1c;
  int i;
  FILE *fp_local;
  DICT *this_local;
  
  sVar1 = std::vector<vox::DICTitem,_std::allocator<vox::DICTitem>_>::size(&this->keys);
  this->count = (int32_t)sVar1;
  fwrite(this,4,1,(FILE *)CONCAT44(in_register_00000034,__fd));
  local_1c = 0;
  while( true ) {
    if (this->count <= (int)local_1c) break;
    __n_00 = this;
    this_00 = std::vector<vox::DICTitem,_std::allocator<vox::DICTitem>_>::operator[]
                        (&this->keys,(long)(int)local_1c);
    DICTitem::write(this_00,__fd,__buf_00,(size_t)__n_00);
    local_1c = local_1c + 1;
  }
  return (ulong)local_1c;
}

Assistant:

void DICT::write(FILE* fp) {
    count = (int32_t)keys.size();
    fwrite(&count, sizeof(int32_t), 1, fp);
    for (int i = 0; i < count; i++)
        keys[i].write(fp);
}